

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NEST.cpp
# Opt level: O0

double NEST::NESTcalc::interpolateFunction
                 (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                  *func,double x,bool isLogLog)

{
  size_type sVar1;
  const_reference pvVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double logy_desired;
  double slope_1;
  double logy2;
  double logy1;
  double logx2;
  double logx1;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *pvStack_68;
  int iP_1;
  double y_desired_1;
  double slope;
  double y2;
  double y1;
  double x2;
  double x1;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *pvStack_30;
  int iP;
  double y_desired;
  bool isLogLog_local;
  double x_local;
  vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *func_local;
  
  if (isLogLog) {
    pvStack_68 = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 0x0;
    logx1._4_4_ = 0;
    while( true ) {
      sVar1 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(func);
      if (sVar1 - 1 <= (ulong)(long)logx1._4_4_) break;
      pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](func,(long)logx1._4_4_);
      dVar3 = log10(pvVar2->first);
      pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](func,(long)(logx1._4_4_ + 1));
      dVar4 = log10(pvVar2->first);
      dVar5 = log10(x);
      if (dVar3 < dVar5) {
        dVar5 = log10(x);
        if (dVar5 < dVar4) {
          pvVar2 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](func,(long)logx1._4_4_);
          dVar5 = log10(pvVar2->second);
          pvVar2 = std::
                   vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
                   operator[](func,(long)(logx1._4_4_ + 1));
          dVar6 = log10(pvVar2->second);
          dVar7 = log10(x);
          pvStack_68 = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                        *)std::pow<int,double>
                                    (10,((dVar6 - dVar5) / (dVar4 - dVar3)) * (dVar7 - dVar3) +
                                        dVar5);
          break;
        }
      }
      logx1._4_4_ = logx1._4_4_ + 1;
    }
    func_local = pvStack_68;
  }
  else {
    pvStack_30 = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_> *)
                 0x0;
    x1._4_4_ = 0;
    while( true ) {
      sVar1 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
              size(func);
      if (sVar1 - 1 <= (ulong)(long)x1._4_4_) break;
      pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](func,(long)x1._4_4_);
      dVar3 = pvVar2->first;
      pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>::
               operator[](func,(long)(x1._4_4_ + 1));
      dVar4 = pvVar2->first;
      if ((dVar3 < x) && (x <= dVar4)) {
        pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](func,(long)x1._4_4_);
        dVar5 = pvVar2->second;
        pvVar2 = std::vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                 ::operator[](func,(long)(x1._4_4_ + 1));
        pvStack_30 = (vector<std::pair<double,_double>,_std::allocator<std::pair<double,_double>_>_>
                      *)(((pvVar2->second - dVar5) / (dVar4 - dVar3)) * (x - dVar3) + dVar5);
        break;
      }
      x1._4_4_ = x1._4_4_ + 1;
    }
    func_local = pvStack_30;
  }
  return (double)func_local;
}

Assistant:

double NESTcalc::interpolateFunction(
    const std::vector<std::pair<double, double> > &func, double x,
    bool isLogLog) {
  // Linear interpolation
  if (!isLogLog) {
    double y_desired = 0;
    for (int iP = 0; iP < func.size() - 1; ++iP) {
      double x1 = func[iP].first;
      double x2 = func[iP + 1].first;
      if (x1 < x && x2 >= x) {
        double y1 = func[iP].second;
        double y2 = func[iP + 1].second;
        double slope = (y2 - y1) / (x2 - x1);
        y_desired = y1 + (slope * (x - x1));
        break;
      }
    }
    return y_desired;
  }

  // Linear interpolation on a log-log scale (more accurate at high fields,
  // where points are far apart on a linear scale)
  else {
    double y_desired = 0;
    for (int iP = 0; iP < func.size() - 1; ++iP) {
      double logx1 = log10(func[iP].first);
      double logx2 = log10(func[iP + 1].first);
      if (logx1 < log10(x) && logx2 > log10(x)) {
        double logy1 = log10(func[iP].second);
        double logy2 = log10(func[iP + 1].second);
        double slope = (logy2 - logy1) / (logx2 - logx1);
        double logy_desired = logy1 + slope * (log10(x) - logx1);
        y_desired = pow(10, logy_desired);
        break;
      }
    }
    return y_desired;
  }
}